

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsBool helicsCoreConnect(HelicsCore core,HelicsError *err)

{
  uint uVar1;
  Core *pCVar2;
  
  pCVar2 = getCore(core,err);
  uVar1 = 0;
  if (pCVar2 != (Core *)0x0) {
    uVar1 = (*pCVar2->_vptr_Core[6])(pCVar2);
    uVar1 = uVar1 & 0xff;
  }
  return uVar1;
}

Assistant:

HelicsBool helicsCoreConnect(HelicsCore core, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return HELICS_FALSE;
    }

    try {
        return (cppcore->connect()) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}